

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfers.c
# Opt level: O0

void read_transfer(transfer_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  transfer_type_t tVar2;
  ulong uVar3;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  transfer_t *record_local;
  
  init_transfer(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"from_stop_id");
    if (iVar1 == 0) {
      strcpy(record->from_stop_id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"to_stop_id");
      if (iVar1 == 0) {
        strcpy(record->to_stop_id,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"transfer_type");
        if (iVar1 == 0) {
          tVar2 = parse_transfer_type(field_values[local_2c]);
          record->transfer_type = tVar2;
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"min_transfer_time");
          if (iVar1 == 0) {
            uVar3 = strtoul(field_values[local_2c],(char **)0x0,0);
            record->min_transfer_time = (uint)uVar3;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_transfer(transfer_t *record, int field_count, const char **field_names, const char **field_values) {
    init_transfer(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "from_stop_id") == 0) {
            strcpy(record->from_stop_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "to_stop_id") == 0) {
            strcpy(record->to_stop_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "transfer_type") == 0) {
            record->transfer_type = parse_transfer_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "min_transfer_time") == 0) {
            record->min_transfer_time = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
    }
}